

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O2

void free_cdef_row_sync(AV1CdefRowSync **cdef_row_mt,int num_mi_rows)

{
  pthread_mutex_t *__mutex;
  pthread_cond_t *__cond;
  ulong uVar1;
  AV1CdefRowSync *memblk;
  ulong uVar2;
  
  if (*cdef_row_mt != (AV1CdefRowSync *)0x0) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)num_mi_rows;
    if (num_mi_rows < 1) {
      uVar1 = uVar2;
    }
    for (; memblk = *cdef_row_mt, uVar1 * 0x18 - uVar2 != 0; uVar2 = uVar2 + 0x18) {
      __mutex = *(pthread_mutex_t **)((long)&memblk->row_mutex_ + uVar2);
      if (__mutex != (pthread_mutex_t *)0x0) {
        pthread_mutex_destroy(__mutex);
        aom_free(*(void **)((long)&(*cdef_row_mt)->row_mutex_ + uVar2));
        memblk = *cdef_row_mt;
      }
      __cond = *(pthread_cond_t **)((long)&memblk->row_cond_ + uVar2);
      if (__cond != (pthread_cond_t *)0x0) {
        pthread_cond_destroy(__cond);
        aom_free(*(void **)((long)&(*cdef_row_mt)->row_cond_ + uVar2));
      }
    }
    aom_free(memblk);
    *cdef_row_mt = (AV1CdefRowSync *)0x0;
  }
  return;
}

Assistant:

static inline void free_cdef_row_sync(AV1CdefRowSync **cdef_row_mt,
                                      const int num_mi_rows) {
  if (*cdef_row_mt == NULL) return;
#if CONFIG_MULTITHREAD
  for (int row_idx = 0; row_idx < num_mi_rows; row_idx++) {
    if ((*cdef_row_mt)[row_idx].row_mutex_ != NULL) {
      pthread_mutex_destroy((*cdef_row_mt)[row_idx].row_mutex_);
      aom_free((*cdef_row_mt)[row_idx].row_mutex_);
    }
    if ((*cdef_row_mt)[row_idx].row_cond_ != NULL) {
      pthread_cond_destroy((*cdef_row_mt)[row_idx].row_cond_);
      aom_free((*cdef_row_mt)[row_idx].row_cond_);
    }
  }
#else
  (void)num_mi_rows;
#endif  // CONFIG_MULTITHREAD
  aom_free(*cdef_row_mt);
  *cdef_row_mt = NULL;
}